

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-item-use.c
# Opt level: O2

_Bool borg_recharging(void)

{
  borg_item_conflict *pbVar1;
  _Bool _Var2;
  short sVar3;
  char *pcVar4;
  bool bVar5;
  ulong uVar6;
  long lVar7;
  angband_constants *paVar8;
  
  if ((borg.trait[0x70] == 0) && (borg.trait[0x72] == 0)) {
    lVar7 = 0;
    paVar8 = z_info;
    for (uVar6 = 0; pbVar1 = borg_items, uVar6 < paVar8->pack_size; uVar6 = uVar6 + 1) {
      if ((((borg_items->curses[lVar7 + -0x26] != false) &&
           (borg_items->curses[lVar7 + -0x2e] == true)) &&
          (borg_items->curses[lVar7 + -0x2c] == true)) &&
         ((*(char **)(borg_items->curses + lVar7 + -0x3a) == (char *)0x0 ||
          (pcVar4 = strstr(*(char **)(borg_items->curses + lVar7 + -0x3a),"empty"),
          pcVar4 == (char *)0x0)))) {
        if (pbVar1->curses[lVar7 + -0x2a] == true) {
          if (*(short *)(pbVar1->curses + lVar7 + -0x28) < 2) {
LAB_00219cbd:
            _Var2 = borg_read_scroll(sv_scroll_recharging);
            if ((!_Var2) &&
               ((_Var2 = borg_spell_fail(RECHARGING,L'`'), !_Var2 &&
                (_Var2 = borg_activate_item(act_recharge), !_Var2)))) {
              return false;
            }
            pcVar4 = format("Recharging %s with current charge of %d",pbVar1->desc + lVar7,
                            (ulong)(uint)(int)*(short *)(pbVar1->curses + lVar7 + -0x28));
            borg_note(pcVar4);
            borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[uVar6]);
            if (*(char **)(pbVar1->curses + lVar7 + -0x3a) == (char *)0x0) {
              return true;
            }
            pcVar4 = strstr(*(char **)(pbVar1->curses + lVar7 + -0x3a),"empty");
            if (pcVar4 != (char *)0x0) {
              borg_deinscribe((int)uVar6);
              return true;
            }
            return true;
          }
        }
        else if (pbVar1->curses[lVar7 + -0x2a] == true) {
          sVar3 = *(short *)(pbVar1->curses + lVar7 + -0x28);
          if (sVar3 < 2) {
            _Var2 = borg_spell_okay_fail(RECHARGING,L'`');
            if (_Var2) {
              bVar5 = (int)(uint)pbVar1->curses[lVar7 + -0x29] < sv_staff_power;
            }
            else {
              bVar5 = false;
            }
            sVar3 = *(short *)(pbVar1->curses + lVar7 + -0x28);
            paVar8 = z_info;
          }
          else {
            bVar5 = false;
          }
          bVar5 = (bool)(sVar3 < 2 | bVar5);
          if ((sv_staff_teleportation == (uint)pbVar1->curses[lVar7 + -0x29]) && (sVar3 < 3)) {
            bVar5 = (bool)(bVar5 | borg.trait[0x69] == 0);
          }
          if ((sVar3 < 1 || (int)((int)sVar3 + (uint)pbVar1->curses[lVar7 + -0x26]) < 4) && (bVar5))
          goto LAB_00219cbd;
        }
      }
      lVar7 = lVar7 + 0x388;
    }
  }
  return false;
}

Assistant:

bool borg_recharging(void)
{
    int  i      = -1;
    bool charge = false;

    /* Forbid blind/confused */
    if (borg.trait[BI_ISBLIND] || borg.trait[BI_ISCONFUSED])
        return false;

    /* XXX XXX XXX Dark */

    /* Look for an item to recharge */
    for (i = 0; i < z_info->pack_size; i++) {
        borg_item *item = &borg_items[i];

        /* Skip empty items */
        if (!item->iqty)
            continue;

        /* Skip non-identified items */
        if (!item->ident || !item->aware)
            continue;

        if (item->note && strstr(item->note, "empty"))
            continue;

        /* assume we can't charge it. */
        charge = false;

        /* Wands with no charges can be charged */
        if ((item->tval == TV_WAND) && (item->pval <= 1))
            charge = true;

        /* recharge staves sometimes */
        if (item->tval == TV_STAFF) {
            /* Allow staves to be recharged at 2 charges if
             * the borg has the big recharge spell. And its not a *Dest*
             */
            if ((item->pval < 2) && (borg_spell_okay_fail(RECHARGING, 96))
                && item->sval < sv_staff_power)
                charge = true;

            /* recharge any staff at 0 charges */
            if (item->pval <= 1)
                charge = true;

            /* Staves of teleport get recharged at 2 charges in town */
            if ((item->sval == sv_staff_teleportation) && (item->pval < 3)
                && !borg.trait[BI_CDEPTH])
                charge = true;

            /* They stack.  If quantity is 4 and pval is 1, then there are 4
             * charges. */
            if ((item->iqty + item->pval >= 4) && item->pval >= 1)
                charge = false;
        }

        /* get the next item if we are not to charge this one */
        if (!charge)
            continue;

        /* Attempt to recharge */
        if (borg_read_scroll(sv_scroll_recharging)
            || borg_spell_fail(RECHARGING, 96)
            || borg_activate_item(act_recharge)) {
            /* Message */
            borg_note(format("Recharging %s with current charge of %d",
                item->desc, item->pval));

            /* Recharge the item */
            borg_keypress(all_letters_nohjkl[i]);

            /* Remove the {empty} if present */
            if (item->note && strstr(item->note, "empty"))
                borg_deinscribe(i);

            /* Success */
            return true;
        } else
            /* if we fail once, no need to try again. */
            break;
    }

    /* Nope */
    return false;
}